

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

int rw::Engine::open(char *__file,int __oflag,...)

{
  FILE *__stream;
  char *pcVar1;
  ObjPipeline *pOVar2;
  void *pvVar3;
  uint local_24;
  uint32 local_20;
  uint i;
  Error _e;
  EngineOpenParams *p_local;
  
  _e = (Error)__file;
  if ((engine == (undefined8 *)0x0) && (state == 1)) {
    engine = (undefined8 *)
             mustmalloc_LOC((long)s_plglist,0x40000,
                            "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/engine.cpp line: 254"
                           );
    *engine = 0;
    engine[1] = 0;
    engine[4] = fopen;
    engine[5] = fclose;
    engine[6] = fseek;
    engine[7] = ftell;
    engine[8] = fread;
    engine[9] = fwrite;
    engine[10] = feof;
    memcpy(engine + 0x18,null::renderdevice,0x88);
    (*(code *)engine[0x28])(2,_e,0);
    pOVar2 = ObjPipeline::create();
    engine[0x29] = pOVar2;
    for (local_24 = 0; local_24 < 0xd; local_24 = local_24 + 1) {
      pvVar3 = mustmalloc_LOC((long)*(int *)(Driver::s_plglist + (ulong)local_24 * 0x18),0x40000,
                              "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/engine.cpp line: 282"
                             );
      engine[(ulong)local_24 + 0xb] = pvVar3;
      *(undefined8 *)engine[(ulong)local_24 + 0xb] = engine[0x29];
      *(code **)(engine[(ulong)local_24 + 0xb] + 0x10) = null::rasterCreate;
      *(code **)(engine[(ulong)local_24 + 0xb] + 0x18) = null::rasterLock;
      *(code **)(engine[(ulong)local_24 + 0xb] + 0x20) = null::rasterUnlock;
      *(code **)(engine[(ulong)local_24 + 0xb] + 0x28) = null::rasterLockPalette;
      *(code **)(engine[(ulong)local_24 + 0xb] + 0x30) = null::rasterUnlockPalette;
      *(code **)(engine[(ulong)local_24 + 0xb] + 0x38) = null::rasterNumLevels;
      *(code **)(engine[(ulong)local_24 + 0xb] + 0x40) = null::imageFindRasterFormat;
      *(code **)(engine[(ulong)local_24 + 0xb] + 0x48) = null::rasterFromImage;
      *(code **)(engine[(ulong)local_24 + 0xb] + 0x50) = null::rasterToImage;
    }
    state = 2;
    p_local._4_4_ = 1;
  }
  else {
    local_20 = 0;
    i = 0x80000008;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/engine.cpp",0xf9);
    __stream = _stderr;
    pcVar1 = dbgsprint(0x80000008);
    fprintf(__stream,"%s\n",pcVar1);
    setError((Error *)&stack0xffffffffffffffe0);
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

bool32
Engine::open(EngineOpenParams *p)
{
	if(engine || Engine::state != Initialized){
		RWERROR((ERR_ENGINEOPEN));
		return 0;
	}

	// Allocate engine
	engine = (Engine*)rwNew(Engine::s_plglist.size, MEMDUR_GLOBAL);
	engine->currentCamera = nil;
	engine->currentWorld = nil;
	engine->filefuncs.rwfopen = (void *(*)(const char*, const char*))fopen;
	engine->filefuncs.rwfclose = (int (*)(void*))fclose;
	engine->filefuncs.rwfseek = (int (*)(void*, long, int))fseek;
	engine->filefuncs.rwftell = (long (*)(void*))ftell;
	engine->filefuncs.rwfread = (size_t (*)(void*, size_t, size_t, void*))fread;
	engine->filefuncs.rwfwrite = (size_t (*)(const void*, size_t, size_t, void*))fwrite;
	engine->filefuncs.rwfeof = (int (*)(void*))feof;

	// Initialize device
	// Device and possibly OS specific!
#ifdef RW_PS2
	engine->device = ps2::renderdevice;
#elif RW_GL3
	engine->device = gl3::renderdevice;
#elif RW_D3D9
	engine->device = d3d::renderdevice;
#else
	engine->device = null::renderdevice;
#endif

	engine->device.system(DEVICEOPEN, (void*)p, 0);

	engine->dummyDefaultPipeline = ObjPipeline::create();
	for(uint i = 0; i < NUM_PLATFORMS; i++){
		rw::engine->driver[i] = (Driver*)rwNew(Driver::s_plglist[i].size,
			MEMDUR_GLOBAL);

		engine->driver[i]->defaultPipeline = engine->dummyDefaultPipeline;

		engine->driver[i]->rasterCreate = null::rasterCreate;
		engine->driver[i]->rasterLock = null::rasterLock;
		engine->driver[i]->rasterUnlock = null::rasterUnlock;
		engine->driver[i]->rasterLockPalette = null::rasterLockPalette;
		engine->driver[i]->rasterUnlockPalette = null::rasterUnlockPalette;
		engine->driver[i]->rasterNumLevels = null::rasterNumLevels;
		engine->driver[i]->imageFindRasterFormat = null::imageFindRasterFormat;
		engine->driver[i]->rasterFromImage = null::rasterFromImage;
		engine->driver[i]->rasterToImage = null::rasterToImage;
	}

	Engine::state = Opened;
	return 1;
}